

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void anon_unknown.dwarf_52fa3::list_item_verbose(FILE *out,archive_entry *entry)

{
  time_t __format;
  char *pcVar1;
  uint uVar2;
  mode_t mVar3;
  char *pcVar4;
  la_int64_t lVar5;
  size_t sVar6;
  tm *__tp;
  undefined8 uVar7;
  string local_e8;
  dev_t local_c8;
  unsigned_long rdevminor;
  unsigned_long rdevmajor;
  size_t gs_width;
  size_t u_width;
  time_t tim;
  char *fmt;
  char *p;
  size_t w;
  char tmp [100];
  archive_entry *entry_local;
  FILE *out_local;
  
  gs_width = 6;
  rdevmajor = 0xd;
  if (list_item_verbose::now == 0) {
    time(&list_item_verbose::now);
  }
  pcVar4 = archive_entry_strmode((archive_entry_conflict *)entry);
  uVar2 = archive_entry_nlink(entry);
  fprintf((FILE *)out,"%s %d ",pcVar4,(ulong)uVar2);
  fmt = archive_entry_uname(entry);
  if ((fmt == (char *)0x0) || (*fmt == '\0')) {
    lVar5 = archive_entry_uid(entry);
    sprintf((char *)&w,"%lu ",lVar5);
    fmt = (char *)&w;
  }
  p = (char *)strlen(fmt);
  if (gs_width < p) {
    gs_width = (size_t)p;
  }
  fprintf((FILE *)out,"%-*s ",gs_width & 0xffffffff,fmt);
  fmt = archive_entry_gname(entry);
  if ((fmt == (char *)0x0) || (*fmt == '\0')) {
    lVar5 = archive_entry_gid(entry);
    sprintf((char *)&w,"%lu",lVar5);
    p = (char *)strlen((char *)&w);
    fprintf((FILE *)out,"%s",&w);
  }
  else {
    fprintf((FILE *)out,"%s",fmt);
    p = (char *)strlen(fmt);
  }
  mVar3 = archive_entry_filetype(entry);
  if ((mVar3 == 0x2000) || (mVar3 = archive_entry_filetype(entry), mVar3 == 0x6000)) {
    rdevminor = archive_entry_rdevmajor(entry);
    local_c8 = archive_entry_rdevminor(entry);
    sprintf((char *)&w,"%lu,%lu",rdevminor,local_c8);
  }
  else {
    lVar5 = archive_entry_size(entry);
    sprintf((char *)&w,"%lu",lVar5);
  }
  pcVar4 = p;
  sVar6 = strlen((char *)&w);
  pcVar1 = p;
  if (rdevmajor <= pcVar4 + sVar6) {
    sVar6 = strlen((char *)&w);
    rdevmajor = (unsigned_long)(pcVar1 + sVar6 + 1);
  }
  fprintf((FILE *)out,"%*s",(ulong)(uint)((int)rdevmajor - (int)p),&w);
  u_width = archive_entry_mtime(entry);
  if (((long)u_width < list_item_verbose::now + -0xf099c0) ||
     (list_item_verbose::now + 0xf099c0 < (long)u_width)) {
    tim = (time_t)anon_var_dwarf_56852;
  }
  else {
    tim = (time_t)anon_var_dwarf_5685f;
  }
  __format = tim;
  __tp = localtime((time_t *)&u_width);
  strftime((char *)&w,100,(char *)__format,__tp);
  fprintf((FILE *)out," %s ",&w);
  cm_archive_entry_pathname_abi_cxx11_(&local_e8,entry);
  uVar7 = std::__cxx11::string::c_str();
  fprintf((FILE *)out,"%s",uVar7);
  std::__cxx11::string::~string((string *)&local_e8);
  pcVar4 = archive_entry_hardlink(entry);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = archive_entry_symlink(entry);
    if (pcVar4 != (char *)0x0) {
      pcVar4 = archive_entry_symlink(entry);
      fprintf((FILE *)out," -> %s",pcVar4);
    }
  }
  else {
    pcVar4 = archive_entry_hardlink(entry);
    fprintf((FILE *)out," link to %s",pcVar4);
  }
  fflush((FILE *)out);
  return;
}

Assistant:

void list_item_verbose(FILE* out, struct archive_entry* entry)
{
  char tmp[100];
  size_t w;
  const char* p;
  const char* fmt;
  time_t tim;
  static time_t now;
  size_t u_width = 6;
  size_t gs_width = 13;

  /*
   * We avoid collecting the entire list in memory at once by
   * listing things as we see them.  However, that also means we can't
   * just pre-compute the field widths.  Instead, we start with guesses
   * and just widen them as necessary.  These numbers are completely
   * arbitrary.
   */
  if (!now) {
    time(&now);
  }
  fprintf(out, "%s %d ", archive_entry_strmode(entry),
          archive_entry_nlink(entry));

  /* Use uname if it's present, else uid. */
  p = archive_entry_uname(entry);
  if ((p == nullptr) || (*p == '\0')) {
    sprintf(tmp, "%lu ", static_cast<unsigned long>(archive_entry_uid(entry)));
    p = tmp;
  }
  w = strlen(p);
  if (w > u_width) {
    u_width = w;
  }
  fprintf(out, "%-*s ", static_cast<int>(u_width), p);
  /* Use gname if it's present, else gid. */
  p = archive_entry_gname(entry);
  if (p != nullptr && p[0] != '\0') {
    fprintf(out, "%s", p);
    w = strlen(p);
  } else {
    sprintf(tmp, "%lu", static_cast<unsigned long>(archive_entry_gid(entry)));
    w = strlen(tmp);
    fprintf(out, "%s", tmp);
  }

  /*
   * Print device number or file size, right-aligned so as to make
   * total width of group and devnum/filesize fields be gs_width.
   * If gs_width is too small, grow it.
   */
  if (archive_entry_filetype(entry) == AE_IFCHR ||
      archive_entry_filetype(entry) == AE_IFBLK) {
    unsigned long rdevmajor = archive_entry_rdevmajor(entry);
    unsigned long rdevminor = archive_entry_rdevminor(entry);
    sprintf(tmp, "%lu,%lu", rdevmajor, rdevminor);
  } else {
    /*
     * Note the use of platform-dependent macros to format
     * the filesize here.  We need the format string and the
     * corresponding type for the cast.
     */
    sprintf(tmp, BSDTAR_FILESIZE_PRINTF,
            static_cast<BSDTAR_FILESIZE_TYPE>(archive_entry_size(entry)));
  }
  if (w + strlen(tmp) >= gs_width) {
    gs_width = w + strlen(tmp) + 1;
  }
  fprintf(out, "%*s", static_cast<int>(gs_width - w), tmp);

  /* Format the time using 'ls -l' conventions. */
  tim = archive_entry_mtime(entry);
#  define HALF_YEAR ((time_t)365 * 86400 / 2)
#  if defined(_WIN32) && !defined(__CYGWIN__)
/* Windows' strftime function does not support %e format. */
#    define DAY_FMT "%d"
#  else
#    define DAY_FMT "%e" /* Day number without leading zeros */
#  endif
  if (tim < now - HALF_YEAR || tim > now + HALF_YEAR) {
    fmt = DAY_FMT " %b  %Y";
  } else {
    fmt = DAY_FMT " %b %H:%M";
  }
  strftime(tmp, sizeof(tmp), fmt, localtime(&tim));
  fprintf(out, " %s ", tmp);
  fprintf(out, "%s", cm_archive_entry_pathname(entry).c_str());

  /* Extra information for links. */
  if (archive_entry_hardlink(entry)) /* Hard link */
  {
    fprintf(out, " link to %s", archive_entry_hardlink(entry));
  } else if (archive_entry_symlink(entry)) /* Symbolic link */
  {
    fprintf(out, " -> %s", archive_entry_symlink(entry));
  }
  fflush(out);
}